

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_min_max.cpp
# Opt level: O3

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> __thiscall
duckdb::ArgMinMaxNBind<duckdb::GreaterThan>
          (duckdb *this,ClientContext *context,AggregateFunction *function,
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
          *arguments)

{
  Expression EVar1;
  Expression EVar2;
  pointer puVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  pointer pEVar6;
  reference pvVar7;
  code *pcVar8;
  ParameterNotResolvedException *this_00;
  code *pcVar9;
  code *pcVar10;
  code *pcVar11;
  code *pcVar12;
  code *pcVar13;
  pointer this_01;
  LogicalType local_40;
  undefined1 local_3f;
  undefined8 local_38;
  undefined8 uStack_30;
  
  puVar3 = (arguments->
           super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
           ).
           super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (this_01 = (arguments->
                 super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                 ).
                 super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; this_01 != puVar3; this_01 = this_01 + 1
      ) {
    pEVar6 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->(this_01);
    if (pEVar6[0x38] == (Expression)0x2) {
      this_00 = (ParameterNotResolvedException *)__cxa_allocate_exception(0x10);
      duckdb::ParameterNotResolvedException::ParameterNotResolvedException(this_00);
      __cxa_throw(this_00,&ParameterNotResolvedException::typeinfo,
                  std::runtime_error::~runtime_error);
    }
  }
  pvVar7 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
           ::operator[](arguments,0);
  pEVar6 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     (pvVar7);
  EVar1 = pEVar6[0x39];
  pvVar7 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
           ::operator[](arguments,1);
  pEVar6 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     (pvVar7);
  EVar2 = pEVar6[0x39];
  switch(EVar1) {
  case (Expression)0x7:
    switch(EVar2) {
    case (Expression)0x7:
      pcVar8 = 
      ArgMinMaxNUpdate<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<int>,duckdb::MinMaxFixedValue<int>,duckdb::GreaterThan>>
      ;
      pcVar9 = MinMaxNOperation::
               Finalize<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<int>,duckdb::MinMaxFixedValue<int>,duckdb::GreaterThan>>
      ;
      pcVar10 = AggregateFunction::
                StateDestroy<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<int>,duckdb::MinMaxFixedValue<int>,duckdb::GreaterThan>,duckdb::MinMaxNOperation>
      ;
      pcVar11 = AggregateFunction::
                StateCombine<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<int>,duckdb::MinMaxFixedValue<int>,duckdb::GreaterThan>,duckdb::MinMaxNOperation>
      ;
      pcVar12 = AggregateFunction::
                StateInitialize<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<int>,duckdb::MinMaxFixedValue<int>,duckdb::GreaterThan>,duckdb::MinMaxNOperation,(duckdb::AggregateDestructorType)1>
      ;
      pcVar13 = AggregateFunction::
                StateSize<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<int>,duckdb::MinMaxFixedValue<int>,duckdb::GreaterThan>>
      ;
      break;
    case (Expression)0x9:
      pcVar8 = 
      ArgMinMaxNUpdate<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<int>,duckdb::MinMaxFixedValue<long>,duckdb::GreaterThan>>
      ;
      pcVar9 = MinMaxNOperation::
               Finalize<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<int>,duckdb::MinMaxFixedValue<long>,duckdb::GreaterThan>>
      ;
      pcVar10 = AggregateFunction::
                StateDestroy<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<int>,duckdb::MinMaxFixedValue<long>,duckdb::GreaterThan>,duckdb::MinMaxNOperation>
      ;
      pcVar11 = AggregateFunction::
                StateCombine<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<int>,duckdb::MinMaxFixedValue<long>,duckdb::GreaterThan>,duckdb::MinMaxNOperation>
      ;
      pcVar12 = AggregateFunction::
                StateInitialize<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<int>,duckdb::MinMaxFixedValue<long>,duckdb::GreaterThan>,duckdb::MinMaxNOperation,(duckdb::AggregateDestructorType)1>
      ;
      pcVar13 = AggregateFunction::
                StateSize<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<int>,duckdb::MinMaxFixedValue<long>,duckdb::GreaterThan>>
      ;
      break;
    case (Expression)0xb:
      pcVar8 = 
      ArgMinMaxNUpdate<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<int>,duckdb::MinMaxFixedValue<float>,duckdb::GreaterThan>>
      ;
      pcVar9 = MinMaxNOperation::
               Finalize<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<int>,duckdb::MinMaxFixedValue<float>,duckdb::GreaterThan>>
      ;
      pcVar10 = AggregateFunction::
                StateDestroy<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<int>,duckdb::MinMaxFixedValue<float>,duckdb::GreaterThan>,duckdb::MinMaxNOperation>
      ;
      pcVar11 = AggregateFunction::
                StateCombine<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<int>,duckdb::MinMaxFixedValue<float>,duckdb::GreaterThan>,duckdb::MinMaxNOperation>
      ;
      pcVar12 = AggregateFunction::
                StateInitialize<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<int>,duckdb::MinMaxFixedValue<float>,duckdb::GreaterThan>,duckdb::MinMaxNOperation,(duckdb::AggregateDestructorType)1>
      ;
      pcVar13 = AggregateFunction::
                StateSize<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<int>,duckdb::MinMaxFixedValue<float>,duckdb::GreaterThan>>
      ;
      break;
    case (Expression)0xc:
      pcVar8 = 
      ArgMinMaxNUpdate<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<int>,duckdb::MinMaxFixedValue<double>,duckdb::GreaterThan>>
      ;
      pcVar9 = MinMaxNOperation::
               Finalize<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<int>,duckdb::MinMaxFixedValue<double>,duckdb::GreaterThan>>
      ;
      pcVar10 = AggregateFunction::
                StateDestroy<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<int>,duckdb::MinMaxFixedValue<double>,duckdb::GreaterThan>,duckdb::MinMaxNOperation>
      ;
      pcVar11 = AggregateFunction::
                StateCombine<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<int>,duckdb::MinMaxFixedValue<double>,duckdb::GreaterThan>,duckdb::MinMaxNOperation>
      ;
      pcVar12 = AggregateFunction::
                StateInitialize<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<int>,duckdb::MinMaxFixedValue<double>,duckdb::GreaterThan>,duckdb::MinMaxNOperation,(duckdb::AggregateDestructorType)1>
      ;
      pcVar13 = AggregateFunction::
                StateSize<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<int>,duckdb::MinMaxFixedValue<double>,duckdb::GreaterThan>>
      ;
      break;
    default:
      if (EVar2 == (Expression)0xc8) {
        pcVar8 = 
        ArgMinMaxNUpdate<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<int>,duckdb::MinMaxStringValue,duckdb::GreaterThan>>
        ;
        pcVar9 = MinMaxNOperation::
                 Finalize<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<int>,duckdb::MinMaxStringValue,duckdb::GreaterThan>>
        ;
        pcVar10 = AggregateFunction::
                  StateDestroy<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<int>,duckdb::MinMaxStringValue,duckdb::GreaterThan>,duckdb::MinMaxNOperation>
        ;
        pcVar11 = AggregateFunction::
                  StateCombine<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<int>,duckdb::MinMaxStringValue,duckdb::GreaterThan>,duckdb::MinMaxNOperation>
        ;
        pcVar12 = AggregateFunction::
                  StateInitialize<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<int>,duckdb::MinMaxStringValue,duckdb::GreaterThan>,duckdb::MinMaxNOperation,(duckdb::AggregateDestructorType)1>
        ;
        pcVar13 = AggregateFunction::
                  StateSize<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<int>,duckdb::MinMaxStringValue,duckdb::GreaterThan>>
        ;
        break;
      }
    case (Expression)0x8:
    case (Expression)0xa:
      pcVar8 = 
      ArgMinMaxNUpdate<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<int>,duckdb::MinMaxFallbackValue,duckdb::GreaterThan>>
      ;
      pcVar9 = MinMaxNOperation::
               Finalize<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<int>,duckdb::MinMaxFallbackValue,duckdb::GreaterThan>>
      ;
      pcVar10 = AggregateFunction::
                StateDestroy<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<int>,duckdb::MinMaxFallbackValue,duckdb::GreaterThan>,duckdb::MinMaxNOperation>
      ;
      pcVar11 = AggregateFunction::
                StateCombine<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<int>,duckdb::MinMaxFallbackValue,duckdb::GreaterThan>,duckdb::MinMaxNOperation>
      ;
      pcVar12 = AggregateFunction::
                StateInitialize<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<int>,duckdb::MinMaxFallbackValue,duckdb::GreaterThan>,duckdb::MinMaxNOperation,(duckdb::AggregateDestructorType)1>
      ;
      pcVar13 = AggregateFunction::
                StateSize<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<int>,duckdb::MinMaxFallbackValue,duckdb::GreaterThan>>
      ;
    }
    break;
  case (Expression)0x8:
  case (Expression)0xa:
code_r0x00462ed4:
    switch(EVar2) {
    case (Expression)0x7:
      pcVar8 = 
      ArgMinMaxNUpdate<duckdb::ArgMinMaxNState<duckdb::MinMaxFallbackValue,duckdb::MinMaxFixedValue<int>,duckdb::GreaterThan>>
      ;
      pcVar9 = MinMaxNOperation::
               Finalize<duckdb::ArgMinMaxNState<duckdb::MinMaxFallbackValue,duckdb::MinMaxFixedValue<int>,duckdb::GreaterThan>>
      ;
      pcVar10 = AggregateFunction::
                StateDestroy<duckdb::ArgMinMaxNState<duckdb::MinMaxFallbackValue,duckdb::MinMaxFixedValue<int>,duckdb::GreaterThan>,duckdb::MinMaxNOperation>
      ;
      pcVar11 = AggregateFunction::
                StateCombine<duckdb::ArgMinMaxNState<duckdb::MinMaxFallbackValue,duckdb::MinMaxFixedValue<int>,duckdb::GreaterThan>,duckdb::MinMaxNOperation>
      ;
      pcVar12 = AggregateFunction::
                StateInitialize<duckdb::ArgMinMaxNState<duckdb::MinMaxFallbackValue,duckdb::MinMaxFixedValue<int>,duckdb::GreaterThan>,duckdb::MinMaxNOperation,(duckdb::AggregateDestructorType)1>
      ;
      pcVar13 = AggregateFunction::
                StateSize<duckdb::ArgMinMaxNState<duckdb::MinMaxFallbackValue,duckdb::MinMaxFixedValue<int>,duckdb::GreaterThan>>
      ;
      break;
    case (Expression)0x9:
      pcVar8 = 
      ArgMinMaxNUpdate<duckdb::ArgMinMaxNState<duckdb::MinMaxFallbackValue,duckdb::MinMaxFixedValue<long>,duckdb::GreaterThan>>
      ;
      pcVar9 = MinMaxNOperation::
               Finalize<duckdb::ArgMinMaxNState<duckdb::MinMaxFallbackValue,duckdb::MinMaxFixedValue<long>,duckdb::GreaterThan>>
      ;
      pcVar10 = AggregateFunction::
                StateDestroy<duckdb::ArgMinMaxNState<duckdb::MinMaxFallbackValue,duckdb::MinMaxFixedValue<long>,duckdb::GreaterThan>,duckdb::MinMaxNOperation>
      ;
      pcVar11 = AggregateFunction::
                StateCombine<duckdb::ArgMinMaxNState<duckdb::MinMaxFallbackValue,duckdb::MinMaxFixedValue<long>,duckdb::GreaterThan>,duckdb::MinMaxNOperation>
      ;
      pcVar12 = AggregateFunction::
                StateInitialize<duckdb::ArgMinMaxNState<duckdb::MinMaxFallbackValue,duckdb::MinMaxFixedValue<long>,duckdb::GreaterThan>,duckdb::MinMaxNOperation,(duckdb::AggregateDestructorType)1>
      ;
      pcVar13 = AggregateFunction::
                StateSize<duckdb::ArgMinMaxNState<duckdb::MinMaxFallbackValue,duckdb::MinMaxFixedValue<long>,duckdb::GreaterThan>>
      ;
      break;
    case (Expression)0xb:
      pcVar8 = 
      ArgMinMaxNUpdate<duckdb::ArgMinMaxNState<duckdb::MinMaxFallbackValue,duckdb::MinMaxFixedValue<float>,duckdb::GreaterThan>>
      ;
      pcVar9 = MinMaxNOperation::
               Finalize<duckdb::ArgMinMaxNState<duckdb::MinMaxFallbackValue,duckdb::MinMaxFixedValue<float>,duckdb::GreaterThan>>
      ;
      pcVar10 = AggregateFunction::
                StateDestroy<duckdb::ArgMinMaxNState<duckdb::MinMaxFallbackValue,duckdb::MinMaxFixedValue<float>,duckdb::GreaterThan>,duckdb::MinMaxNOperation>
      ;
      pcVar11 = AggregateFunction::
                StateCombine<duckdb::ArgMinMaxNState<duckdb::MinMaxFallbackValue,duckdb::MinMaxFixedValue<float>,duckdb::GreaterThan>,duckdb::MinMaxNOperation>
      ;
      pcVar12 = AggregateFunction::
                StateInitialize<duckdb::ArgMinMaxNState<duckdb::MinMaxFallbackValue,duckdb::MinMaxFixedValue<float>,duckdb::GreaterThan>,duckdb::MinMaxNOperation,(duckdb::AggregateDestructorType)1>
      ;
      pcVar13 = AggregateFunction::
                StateSize<duckdb::ArgMinMaxNState<duckdb::MinMaxFallbackValue,duckdb::MinMaxFixedValue<float>,duckdb::GreaterThan>>
      ;
      break;
    case (Expression)0xc:
      pcVar8 = 
      ArgMinMaxNUpdate<duckdb::ArgMinMaxNState<duckdb::MinMaxFallbackValue,duckdb::MinMaxFixedValue<double>,duckdb::GreaterThan>>
      ;
      pcVar9 = MinMaxNOperation::
               Finalize<duckdb::ArgMinMaxNState<duckdb::MinMaxFallbackValue,duckdb::MinMaxFixedValue<double>,duckdb::GreaterThan>>
      ;
      pcVar10 = AggregateFunction::
                StateDestroy<duckdb::ArgMinMaxNState<duckdb::MinMaxFallbackValue,duckdb::MinMaxFixedValue<double>,duckdb::GreaterThan>,duckdb::MinMaxNOperation>
      ;
      pcVar11 = AggregateFunction::
                StateCombine<duckdb::ArgMinMaxNState<duckdb::MinMaxFallbackValue,duckdb::MinMaxFixedValue<double>,duckdb::GreaterThan>,duckdb::MinMaxNOperation>
      ;
      pcVar12 = AggregateFunction::
                StateInitialize<duckdb::ArgMinMaxNState<duckdb::MinMaxFallbackValue,duckdb::MinMaxFixedValue<double>,duckdb::GreaterThan>,duckdb::MinMaxNOperation,(duckdb::AggregateDestructorType)1>
      ;
      pcVar13 = AggregateFunction::
                StateSize<duckdb::ArgMinMaxNState<duckdb::MinMaxFallbackValue,duckdb::MinMaxFixedValue<double>,duckdb::GreaterThan>>
      ;
      break;
    default:
      if (EVar2 == (Expression)0xc8) {
        pcVar8 = 
        ArgMinMaxNUpdate<duckdb::ArgMinMaxNState<duckdb::MinMaxFallbackValue,duckdb::MinMaxStringValue,duckdb::GreaterThan>>
        ;
        pcVar9 = MinMaxNOperation::
                 Finalize<duckdb::ArgMinMaxNState<duckdb::MinMaxFallbackValue,duckdb::MinMaxStringValue,duckdb::GreaterThan>>
        ;
        pcVar10 = AggregateFunction::
                  StateDestroy<duckdb::ArgMinMaxNState<duckdb::MinMaxFallbackValue,duckdb::MinMaxStringValue,duckdb::GreaterThan>,duckdb::MinMaxNOperation>
        ;
        pcVar11 = AggregateFunction::
                  StateCombine<duckdb::ArgMinMaxNState<duckdb::MinMaxFallbackValue,duckdb::MinMaxStringValue,duckdb::GreaterThan>,duckdb::MinMaxNOperation>
        ;
        pcVar12 = AggregateFunction::
                  StateInitialize<duckdb::ArgMinMaxNState<duckdb::MinMaxFallbackValue,duckdb::MinMaxStringValue,duckdb::GreaterThan>,duckdb::MinMaxNOperation,(duckdb::AggregateDestructorType)1>
        ;
        pcVar13 = AggregateFunction::
                  StateSize<duckdb::ArgMinMaxNState<duckdb::MinMaxFallbackValue,duckdb::MinMaxStringValue,duckdb::GreaterThan>>
        ;
        break;
      }
    case (Expression)0x8:
    case (Expression)0xa:
      pcVar8 = 
      ArgMinMaxNUpdate<duckdb::ArgMinMaxNState<duckdb::MinMaxFallbackValue,duckdb::MinMaxFallbackValue,duckdb::GreaterThan>>
      ;
      pcVar9 = MinMaxNOperation::
               Finalize<duckdb::ArgMinMaxNState<duckdb::MinMaxFallbackValue,duckdb::MinMaxFallbackValue,duckdb::GreaterThan>>
      ;
      pcVar10 = AggregateFunction::
                StateDestroy<duckdb::ArgMinMaxNState<duckdb::MinMaxFallbackValue,duckdb::MinMaxFallbackValue,duckdb::GreaterThan>,duckdb::MinMaxNOperation>
      ;
      pcVar11 = AggregateFunction::
                StateCombine<duckdb::ArgMinMaxNState<duckdb::MinMaxFallbackValue,duckdb::MinMaxFallbackValue,duckdb::GreaterThan>,duckdb::MinMaxNOperation>
      ;
      pcVar12 = AggregateFunction::
                StateInitialize<duckdb::ArgMinMaxNState<duckdb::MinMaxFallbackValue,duckdb::MinMaxFallbackValue,duckdb::GreaterThan>,duckdb::MinMaxNOperation,(duckdb::AggregateDestructorType)1>
      ;
      pcVar13 = AggregateFunction::
                StateSize<duckdb::ArgMinMaxNState<duckdb::MinMaxFallbackValue,duckdb::MinMaxFallbackValue,duckdb::GreaterThan>>
      ;
    }
    break;
  case (Expression)0x9:
    switch(EVar2) {
    case (Expression)0x7:
      pcVar8 = 
      ArgMinMaxNUpdate<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<long>,duckdb::MinMaxFixedValue<int>,duckdb::GreaterThan>>
      ;
      pcVar9 = MinMaxNOperation::
               Finalize<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<long>,duckdb::MinMaxFixedValue<int>,duckdb::GreaterThan>>
      ;
      pcVar10 = AggregateFunction::
                StateDestroy<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<long>,duckdb::MinMaxFixedValue<int>,duckdb::GreaterThan>,duckdb::MinMaxNOperation>
      ;
      pcVar11 = AggregateFunction::
                StateCombine<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<long>,duckdb::MinMaxFixedValue<int>,duckdb::GreaterThan>,duckdb::MinMaxNOperation>
      ;
      pcVar12 = AggregateFunction::
                StateInitialize<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<long>,duckdb::MinMaxFixedValue<int>,duckdb::GreaterThan>,duckdb::MinMaxNOperation,(duckdb::AggregateDestructorType)1>
      ;
      pcVar13 = AggregateFunction::
                StateSize<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<long>,duckdb::MinMaxFixedValue<int>,duckdb::GreaterThan>>
      ;
      break;
    case (Expression)0x9:
      pcVar8 = 
      ArgMinMaxNUpdate<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<long>,duckdb::MinMaxFixedValue<long>,duckdb::GreaterThan>>
      ;
      pcVar9 = MinMaxNOperation::
               Finalize<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<long>,duckdb::MinMaxFixedValue<long>,duckdb::GreaterThan>>
      ;
      pcVar10 = AggregateFunction::
                StateDestroy<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<long>,duckdb::MinMaxFixedValue<long>,duckdb::GreaterThan>,duckdb::MinMaxNOperation>
      ;
      pcVar11 = AggregateFunction::
                StateCombine<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<long>,duckdb::MinMaxFixedValue<long>,duckdb::GreaterThan>,duckdb::MinMaxNOperation>
      ;
      pcVar12 = AggregateFunction::
                StateInitialize<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<long>,duckdb::MinMaxFixedValue<long>,duckdb::GreaterThan>,duckdb::MinMaxNOperation,(duckdb::AggregateDestructorType)1>
      ;
      pcVar13 = AggregateFunction::
                StateSize<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<long>,duckdb::MinMaxFixedValue<long>,duckdb::GreaterThan>>
      ;
      break;
    case (Expression)0xb:
      pcVar8 = 
      ArgMinMaxNUpdate<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<long>,duckdb::MinMaxFixedValue<float>,duckdb::GreaterThan>>
      ;
      pcVar9 = MinMaxNOperation::
               Finalize<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<long>,duckdb::MinMaxFixedValue<float>,duckdb::GreaterThan>>
      ;
      pcVar10 = AggregateFunction::
                StateDestroy<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<long>,duckdb::MinMaxFixedValue<float>,duckdb::GreaterThan>,duckdb::MinMaxNOperation>
      ;
      pcVar11 = AggregateFunction::
                StateCombine<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<long>,duckdb::MinMaxFixedValue<float>,duckdb::GreaterThan>,duckdb::MinMaxNOperation>
      ;
      pcVar12 = AggregateFunction::
                StateInitialize<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<long>,duckdb::MinMaxFixedValue<float>,duckdb::GreaterThan>,duckdb::MinMaxNOperation,(duckdb::AggregateDestructorType)1>
      ;
      pcVar13 = AggregateFunction::
                StateSize<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<long>,duckdb::MinMaxFixedValue<float>,duckdb::GreaterThan>>
      ;
      break;
    case (Expression)0xc:
      pcVar8 = 
      ArgMinMaxNUpdate<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<long>,duckdb::MinMaxFixedValue<double>,duckdb::GreaterThan>>
      ;
      pcVar9 = MinMaxNOperation::
               Finalize<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<long>,duckdb::MinMaxFixedValue<double>,duckdb::GreaterThan>>
      ;
      pcVar10 = AggregateFunction::
                StateDestroy<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<long>,duckdb::MinMaxFixedValue<double>,duckdb::GreaterThan>,duckdb::MinMaxNOperation>
      ;
      pcVar11 = AggregateFunction::
                StateCombine<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<long>,duckdb::MinMaxFixedValue<double>,duckdb::GreaterThan>,duckdb::MinMaxNOperation>
      ;
      pcVar12 = AggregateFunction::
                StateInitialize<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<long>,duckdb::MinMaxFixedValue<double>,duckdb::GreaterThan>,duckdb::MinMaxNOperation,(duckdb::AggregateDestructorType)1>
      ;
      pcVar13 = AggregateFunction::
                StateSize<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<long>,duckdb::MinMaxFixedValue<double>,duckdb::GreaterThan>>
      ;
      break;
    default:
      if (EVar2 == (Expression)0xc8) {
        pcVar8 = 
        ArgMinMaxNUpdate<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<long>,duckdb::MinMaxStringValue,duckdb::GreaterThan>>
        ;
        pcVar9 = MinMaxNOperation::
                 Finalize<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<long>,duckdb::MinMaxStringValue,duckdb::GreaterThan>>
        ;
        pcVar10 = AggregateFunction::
                  StateDestroy<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<long>,duckdb::MinMaxStringValue,duckdb::GreaterThan>,duckdb::MinMaxNOperation>
        ;
        pcVar11 = AggregateFunction::
                  StateCombine<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<long>,duckdb::MinMaxStringValue,duckdb::GreaterThan>,duckdb::MinMaxNOperation>
        ;
        pcVar12 = AggregateFunction::
                  StateInitialize<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<long>,duckdb::MinMaxStringValue,duckdb::GreaterThan>,duckdb::MinMaxNOperation,(duckdb::AggregateDestructorType)1>
        ;
        pcVar13 = AggregateFunction::
                  StateSize<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<long>,duckdb::MinMaxStringValue,duckdb::GreaterThan>>
        ;
        break;
      }
    case (Expression)0x8:
    case (Expression)0xa:
      pcVar8 = 
      ArgMinMaxNUpdate<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<long>,duckdb::MinMaxFallbackValue,duckdb::GreaterThan>>
      ;
      pcVar9 = MinMaxNOperation::
               Finalize<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<long>,duckdb::MinMaxFallbackValue,duckdb::GreaterThan>>
      ;
      pcVar10 = AggregateFunction::
                StateDestroy<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<long>,duckdb::MinMaxFallbackValue,duckdb::GreaterThan>,duckdb::MinMaxNOperation>
      ;
      pcVar11 = AggregateFunction::
                StateCombine<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<long>,duckdb::MinMaxFallbackValue,duckdb::GreaterThan>,duckdb::MinMaxNOperation>
      ;
      pcVar12 = AggregateFunction::
                StateInitialize<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<long>,duckdb::MinMaxFallbackValue,duckdb::GreaterThan>,duckdb::MinMaxNOperation,(duckdb::AggregateDestructorType)1>
      ;
      pcVar13 = AggregateFunction::
                StateSize<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<long>,duckdb::MinMaxFallbackValue,duckdb::GreaterThan>>
      ;
    }
    break;
  case (Expression)0xb:
    switch(EVar2) {
    case (Expression)0x7:
      pcVar8 = 
      ArgMinMaxNUpdate<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<float>,duckdb::MinMaxFixedValue<int>,duckdb::GreaterThan>>
      ;
      pcVar9 = MinMaxNOperation::
               Finalize<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<float>,duckdb::MinMaxFixedValue<int>,duckdb::GreaterThan>>
      ;
      pcVar10 = AggregateFunction::
                StateDestroy<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<float>,duckdb::MinMaxFixedValue<int>,duckdb::GreaterThan>,duckdb::MinMaxNOperation>
      ;
      pcVar11 = AggregateFunction::
                StateCombine<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<float>,duckdb::MinMaxFixedValue<int>,duckdb::GreaterThan>,duckdb::MinMaxNOperation>
      ;
      pcVar12 = AggregateFunction::
                StateInitialize<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<float>,duckdb::MinMaxFixedValue<int>,duckdb::GreaterThan>,duckdb::MinMaxNOperation,(duckdb::AggregateDestructorType)1>
      ;
      pcVar13 = AggregateFunction::
                StateSize<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<float>,duckdb::MinMaxFixedValue<int>,duckdb::GreaterThan>>
      ;
      break;
    case (Expression)0x9:
      pcVar8 = 
      ArgMinMaxNUpdate<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<float>,duckdb::MinMaxFixedValue<long>,duckdb::GreaterThan>>
      ;
      pcVar9 = MinMaxNOperation::
               Finalize<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<float>,duckdb::MinMaxFixedValue<long>,duckdb::GreaterThan>>
      ;
      pcVar10 = AggregateFunction::
                StateDestroy<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<float>,duckdb::MinMaxFixedValue<long>,duckdb::GreaterThan>,duckdb::MinMaxNOperation>
      ;
      pcVar11 = AggregateFunction::
                StateCombine<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<float>,duckdb::MinMaxFixedValue<long>,duckdb::GreaterThan>,duckdb::MinMaxNOperation>
      ;
      pcVar12 = AggregateFunction::
                StateInitialize<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<float>,duckdb::MinMaxFixedValue<long>,duckdb::GreaterThan>,duckdb::MinMaxNOperation,(duckdb::AggregateDestructorType)1>
      ;
      pcVar13 = AggregateFunction::
                StateSize<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<float>,duckdb::MinMaxFixedValue<long>,duckdb::GreaterThan>>
      ;
      break;
    case (Expression)0xb:
      pcVar8 = 
      ArgMinMaxNUpdate<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<float>,duckdb::MinMaxFixedValue<float>,duckdb::GreaterThan>>
      ;
      pcVar9 = MinMaxNOperation::
               Finalize<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<float>,duckdb::MinMaxFixedValue<float>,duckdb::GreaterThan>>
      ;
      pcVar10 = AggregateFunction::
                StateDestroy<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<float>,duckdb::MinMaxFixedValue<float>,duckdb::GreaterThan>,duckdb::MinMaxNOperation>
      ;
      pcVar11 = AggregateFunction::
                StateCombine<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<float>,duckdb::MinMaxFixedValue<float>,duckdb::GreaterThan>,duckdb::MinMaxNOperation>
      ;
      pcVar12 = AggregateFunction::
                StateInitialize<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<float>,duckdb::MinMaxFixedValue<float>,duckdb::GreaterThan>,duckdb::MinMaxNOperation,(duckdb::AggregateDestructorType)1>
      ;
      pcVar13 = AggregateFunction::
                StateSize<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<float>,duckdb::MinMaxFixedValue<float>,duckdb::GreaterThan>>
      ;
      break;
    case (Expression)0xc:
      pcVar8 = 
      ArgMinMaxNUpdate<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<float>,duckdb::MinMaxFixedValue<double>,duckdb::GreaterThan>>
      ;
      pcVar9 = MinMaxNOperation::
               Finalize<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<float>,duckdb::MinMaxFixedValue<double>,duckdb::GreaterThan>>
      ;
      pcVar10 = AggregateFunction::
                StateDestroy<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<float>,duckdb::MinMaxFixedValue<double>,duckdb::GreaterThan>,duckdb::MinMaxNOperation>
      ;
      pcVar11 = AggregateFunction::
                StateCombine<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<float>,duckdb::MinMaxFixedValue<double>,duckdb::GreaterThan>,duckdb::MinMaxNOperation>
      ;
      pcVar12 = AggregateFunction::
                StateInitialize<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<float>,duckdb::MinMaxFixedValue<double>,duckdb::GreaterThan>,duckdb::MinMaxNOperation,(duckdb::AggregateDestructorType)1>
      ;
      pcVar13 = AggregateFunction::
                StateSize<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<float>,duckdb::MinMaxFixedValue<double>,duckdb::GreaterThan>>
      ;
      break;
    default:
      if (EVar2 == (Expression)0xc8) {
        pcVar8 = 
        ArgMinMaxNUpdate<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<float>,duckdb::MinMaxStringValue,duckdb::GreaterThan>>
        ;
        pcVar9 = MinMaxNOperation::
                 Finalize<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<float>,duckdb::MinMaxStringValue,duckdb::GreaterThan>>
        ;
        pcVar10 = AggregateFunction::
                  StateDestroy<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<float>,duckdb::MinMaxStringValue,duckdb::GreaterThan>,duckdb::MinMaxNOperation>
        ;
        pcVar11 = AggregateFunction::
                  StateCombine<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<float>,duckdb::MinMaxStringValue,duckdb::GreaterThan>,duckdb::MinMaxNOperation>
        ;
        pcVar12 = AggregateFunction::
                  StateInitialize<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<float>,duckdb::MinMaxStringValue,duckdb::GreaterThan>,duckdb::MinMaxNOperation,(duckdb::AggregateDestructorType)1>
        ;
        pcVar13 = AggregateFunction::
                  StateSize<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<float>,duckdb::MinMaxStringValue,duckdb::GreaterThan>>
        ;
        break;
      }
    case (Expression)0x8:
    case (Expression)0xa:
      pcVar8 = 
      ArgMinMaxNUpdate<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<float>,duckdb::MinMaxFallbackValue,duckdb::GreaterThan>>
      ;
      pcVar9 = MinMaxNOperation::
               Finalize<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<float>,duckdb::MinMaxFallbackValue,duckdb::GreaterThan>>
      ;
      pcVar10 = AggregateFunction::
                StateDestroy<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<float>,duckdb::MinMaxFallbackValue,duckdb::GreaterThan>,duckdb::MinMaxNOperation>
      ;
      pcVar11 = AggregateFunction::
                StateCombine<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<float>,duckdb::MinMaxFallbackValue,duckdb::GreaterThan>,duckdb::MinMaxNOperation>
      ;
      pcVar12 = AggregateFunction::
                StateInitialize<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<float>,duckdb::MinMaxFallbackValue,duckdb::GreaterThan>,duckdb::MinMaxNOperation,(duckdb::AggregateDestructorType)1>
      ;
      pcVar13 = AggregateFunction::
                StateSize<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<float>,duckdb::MinMaxFallbackValue,duckdb::GreaterThan>>
      ;
    }
    break;
  case (Expression)0xc:
    switch(EVar2) {
    case (Expression)0x7:
      pcVar8 = 
      ArgMinMaxNUpdate<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<double>,duckdb::MinMaxFixedValue<int>,duckdb::GreaterThan>>
      ;
      pcVar9 = MinMaxNOperation::
               Finalize<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<double>,duckdb::MinMaxFixedValue<int>,duckdb::GreaterThan>>
      ;
      pcVar10 = AggregateFunction::
                StateDestroy<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<double>,duckdb::MinMaxFixedValue<int>,duckdb::GreaterThan>,duckdb::MinMaxNOperation>
      ;
      pcVar11 = AggregateFunction::
                StateCombine<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<double>,duckdb::MinMaxFixedValue<int>,duckdb::GreaterThan>,duckdb::MinMaxNOperation>
      ;
      pcVar12 = AggregateFunction::
                StateInitialize<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<double>,duckdb::MinMaxFixedValue<int>,duckdb::GreaterThan>,duckdb::MinMaxNOperation,(duckdb::AggregateDestructorType)1>
      ;
      pcVar13 = AggregateFunction::
                StateSize<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<double>,duckdb::MinMaxFixedValue<int>,duckdb::GreaterThan>>
      ;
      break;
    case (Expression)0x9:
      pcVar8 = 
      ArgMinMaxNUpdate<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<double>,duckdb::MinMaxFixedValue<long>,duckdb::GreaterThan>>
      ;
      pcVar9 = MinMaxNOperation::
               Finalize<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<double>,duckdb::MinMaxFixedValue<long>,duckdb::GreaterThan>>
      ;
      pcVar10 = AggregateFunction::
                StateDestroy<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<double>,duckdb::MinMaxFixedValue<long>,duckdb::GreaterThan>,duckdb::MinMaxNOperation>
      ;
      pcVar11 = AggregateFunction::
                StateCombine<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<double>,duckdb::MinMaxFixedValue<long>,duckdb::GreaterThan>,duckdb::MinMaxNOperation>
      ;
      pcVar12 = AggregateFunction::
                StateInitialize<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<double>,duckdb::MinMaxFixedValue<long>,duckdb::GreaterThan>,duckdb::MinMaxNOperation,(duckdb::AggregateDestructorType)1>
      ;
      pcVar13 = AggregateFunction::
                StateSize<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<double>,duckdb::MinMaxFixedValue<long>,duckdb::GreaterThan>>
      ;
      break;
    case (Expression)0xb:
      pcVar8 = 
      ArgMinMaxNUpdate<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<double>,duckdb::MinMaxFixedValue<float>,duckdb::GreaterThan>>
      ;
      pcVar9 = MinMaxNOperation::
               Finalize<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<double>,duckdb::MinMaxFixedValue<float>,duckdb::GreaterThan>>
      ;
      pcVar10 = AggregateFunction::
                StateDestroy<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<double>,duckdb::MinMaxFixedValue<float>,duckdb::GreaterThan>,duckdb::MinMaxNOperation>
      ;
      pcVar11 = AggregateFunction::
                StateCombine<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<double>,duckdb::MinMaxFixedValue<float>,duckdb::GreaterThan>,duckdb::MinMaxNOperation>
      ;
      pcVar12 = AggregateFunction::
                StateInitialize<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<double>,duckdb::MinMaxFixedValue<float>,duckdb::GreaterThan>,duckdb::MinMaxNOperation,(duckdb::AggregateDestructorType)1>
      ;
      pcVar13 = AggregateFunction::
                StateSize<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<double>,duckdb::MinMaxFixedValue<float>,duckdb::GreaterThan>>
      ;
      break;
    case (Expression)0xc:
      pcVar8 = 
      ArgMinMaxNUpdate<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<double>,duckdb::MinMaxFixedValue<double>,duckdb::GreaterThan>>
      ;
      pcVar9 = MinMaxNOperation::
               Finalize<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<double>,duckdb::MinMaxFixedValue<double>,duckdb::GreaterThan>>
      ;
      pcVar10 = AggregateFunction::
                StateDestroy<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<double>,duckdb::MinMaxFixedValue<double>,duckdb::GreaterThan>,duckdb::MinMaxNOperation>
      ;
      pcVar11 = AggregateFunction::
                StateCombine<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<double>,duckdb::MinMaxFixedValue<double>,duckdb::GreaterThan>,duckdb::MinMaxNOperation>
      ;
      pcVar12 = AggregateFunction::
                StateInitialize<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<double>,duckdb::MinMaxFixedValue<double>,duckdb::GreaterThan>,duckdb::MinMaxNOperation,(duckdb::AggregateDestructorType)1>
      ;
      pcVar13 = AggregateFunction::
                StateSize<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<double>,duckdb::MinMaxFixedValue<double>,duckdb::GreaterThan>>
      ;
      break;
    default:
      if (EVar2 == (Expression)0xc8) {
        pcVar8 = 
        ArgMinMaxNUpdate<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<double>,duckdb::MinMaxStringValue,duckdb::GreaterThan>>
        ;
        pcVar9 = MinMaxNOperation::
                 Finalize<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<double>,duckdb::MinMaxStringValue,duckdb::GreaterThan>>
        ;
        pcVar10 = AggregateFunction::
                  StateDestroy<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<double>,duckdb::MinMaxStringValue,duckdb::GreaterThan>,duckdb::MinMaxNOperation>
        ;
        pcVar11 = AggregateFunction::
                  StateCombine<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<double>,duckdb::MinMaxStringValue,duckdb::GreaterThan>,duckdb::MinMaxNOperation>
        ;
        pcVar12 = AggregateFunction::
                  StateInitialize<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<double>,duckdb::MinMaxStringValue,duckdb::GreaterThan>,duckdb::MinMaxNOperation,(duckdb::AggregateDestructorType)1>
        ;
        pcVar13 = AggregateFunction::
                  StateSize<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<double>,duckdb::MinMaxStringValue,duckdb::GreaterThan>>
        ;
        break;
      }
    case (Expression)0x8:
    case (Expression)0xa:
      pcVar8 = 
      ArgMinMaxNUpdate<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<double>,duckdb::MinMaxFallbackValue,duckdb::GreaterThan>>
      ;
      pcVar9 = MinMaxNOperation::
               Finalize<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<double>,duckdb::MinMaxFallbackValue,duckdb::GreaterThan>>
      ;
      pcVar10 = AggregateFunction::
                StateDestroy<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<double>,duckdb::MinMaxFallbackValue,duckdb::GreaterThan>,duckdb::MinMaxNOperation>
      ;
      pcVar11 = AggregateFunction::
                StateCombine<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<double>,duckdb::MinMaxFallbackValue,duckdb::GreaterThan>,duckdb::MinMaxNOperation>
      ;
      pcVar12 = AggregateFunction::
                StateInitialize<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<double>,duckdb::MinMaxFallbackValue,duckdb::GreaterThan>,duckdb::MinMaxNOperation,(duckdb::AggregateDestructorType)1>
      ;
      pcVar13 = AggregateFunction::
                StateSize<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<double>,duckdb::MinMaxFallbackValue,duckdb::GreaterThan>>
      ;
    }
    break;
  default:
    if (EVar1 != (Expression)0xc8) goto code_r0x00462ed4;
    switch(EVar2) {
    case (Expression)0x7:
      pcVar8 = 
      ArgMinMaxNUpdate<duckdb::ArgMinMaxNState<duckdb::MinMaxStringValue,duckdb::MinMaxFixedValue<int>,duckdb::GreaterThan>>
      ;
      pcVar9 = MinMaxNOperation::
               Finalize<duckdb::ArgMinMaxNState<duckdb::MinMaxStringValue,duckdb::MinMaxFixedValue<int>,duckdb::GreaterThan>>
      ;
      pcVar10 = AggregateFunction::
                StateDestroy<duckdb::ArgMinMaxNState<duckdb::MinMaxStringValue,duckdb::MinMaxFixedValue<int>,duckdb::GreaterThan>,duckdb::MinMaxNOperation>
      ;
      pcVar11 = AggregateFunction::
                StateCombine<duckdb::ArgMinMaxNState<duckdb::MinMaxStringValue,duckdb::MinMaxFixedValue<int>,duckdb::GreaterThan>,duckdb::MinMaxNOperation>
      ;
      pcVar12 = AggregateFunction::
                StateInitialize<duckdb::ArgMinMaxNState<duckdb::MinMaxStringValue,duckdb::MinMaxFixedValue<int>,duckdb::GreaterThan>,duckdb::MinMaxNOperation,(duckdb::AggregateDestructorType)1>
      ;
      pcVar13 = AggregateFunction::
                StateSize<duckdb::ArgMinMaxNState<duckdb::MinMaxStringValue,duckdb::MinMaxFixedValue<int>,duckdb::GreaterThan>>
      ;
      break;
    case (Expression)0x9:
      pcVar8 = 
      ArgMinMaxNUpdate<duckdb::ArgMinMaxNState<duckdb::MinMaxStringValue,duckdb::MinMaxFixedValue<long>,duckdb::GreaterThan>>
      ;
      pcVar9 = MinMaxNOperation::
               Finalize<duckdb::ArgMinMaxNState<duckdb::MinMaxStringValue,duckdb::MinMaxFixedValue<long>,duckdb::GreaterThan>>
      ;
      pcVar10 = AggregateFunction::
                StateDestroy<duckdb::ArgMinMaxNState<duckdb::MinMaxStringValue,duckdb::MinMaxFixedValue<long>,duckdb::GreaterThan>,duckdb::MinMaxNOperation>
      ;
      pcVar11 = AggregateFunction::
                StateCombine<duckdb::ArgMinMaxNState<duckdb::MinMaxStringValue,duckdb::MinMaxFixedValue<long>,duckdb::GreaterThan>,duckdb::MinMaxNOperation>
      ;
      pcVar12 = AggregateFunction::
                StateInitialize<duckdb::ArgMinMaxNState<duckdb::MinMaxStringValue,duckdb::MinMaxFixedValue<long>,duckdb::GreaterThan>,duckdb::MinMaxNOperation,(duckdb::AggregateDestructorType)1>
      ;
      pcVar13 = AggregateFunction::
                StateSize<duckdb::ArgMinMaxNState<duckdb::MinMaxStringValue,duckdb::MinMaxFixedValue<long>,duckdb::GreaterThan>>
      ;
      break;
    case (Expression)0xb:
      pcVar8 = 
      ArgMinMaxNUpdate<duckdb::ArgMinMaxNState<duckdb::MinMaxStringValue,duckdb::MinMaxFixedValue<float>,duckdb::GreaterThan>>
      ;
      pcVar9 = MinMaxNOperation::
               Finalize<duckdb::ArgMinMaxNState<duckdb::MinMaxStringValue,duckdb::MinMaxFixedValue<float>,duckdb::GreaterThan>>
      ;
      pcVar10 = AggregateFunction::
                StateDestroy<duckdb::ArgMinMaxNState<duckdb::MinMaxStringValue,duckdb::MinMaxFixedValue<float>,duckdb::GreaterThan>,duckdb::MinMaxNOperation>
      ;
      pcVar11 = AggregateFunction::
                StateCombine<duckdb::ArgMinMaxNState<duckdb::MinMaxStringValue,duckdb::MinMaxFixedValue<float>,duckdb::GreaterThan>,duckdb::MinMaxNOperation>
      ;
      pcVar12 = AggregateFunction::
                StateInitialize<duckdb::ArgMinMaxNState<duckdb::MinMaxStringValue,duckdb::MinMaxFixedValue<float>,duckdb::GreaterThan>,duckdb::MinMaxNOperation,(duckdb::AggregateDestructorType)1>
      ;
      pcVar13 = AggregateFunction::
                StateSize<duckdb::ArgMinMaxNState<duckdb::MinMaxStringValue,duckdb::MinMaxFixedValue<float>,duckdb::GreaterThan>>
      ;
      break;
    case (Expression)0xc:
      pcVar8 = 
      ArgMinMaxNUpdate<duckdb::ArgMinMaxNState<duckdb::MinMaxStringValue,duckdb::MinMaxFixedValue<double>,duckdb::GreaterThan>>
      ;
      pcVar9 = MinMaxNOperation::
               Finalize<duckdb::ArgMinMaxNState<duckdb::MinMaxStringValue,duckdb::MinMaxFixedValue<double>,duckdb::GreaterThan>>
      ;
      pcVar10 = AggregateFunction::
                StateDestroy<duckdb::ArgMinMaxNState<duckdb::MinMaxStringValue,duckdb::MinMaxFixedValue<double>,duckdb::GreaterThan>,duckdb::MinMaxNOperation>
      ;
      pcVar11 = AggregateFunction::
                StateCombine<duckdb::ArgMinMaxNState<duckdb::MinMaxStringValue,duckdb::MinMaxFixedValue<double>,duckdb::GreaterThan>,duckdb::MinMaxNOperation>
      ;
      pcVar12 = AggregateFunction::
                StateInitialize<duckdb::ArgMinMaxNState<duckdb::MinMaxStringValue,duckdb::MinMaxFixedValue<double>,duckdb::GreaterThan>,duckdb::MinMaxNOperation,(duckdb::AggregateDestructorType)1>
      ;
      pcVar13 = AggregateFunction::
                StateSize<duckdb::ArgMinMaxNState<duckdb::MinMaxStringValue,duckdb::MinMaxFixedValue<double>,duckdb::GreaterThan>>
      ;
      break;
    default:
      if (EVar2 == (Expression)0xc8) {
        pcVar8 = 
        ArgMinMaxNUpdate<duckdb::ArgMinMaxNState<duckdb::MinMaxStringValue,duckdb::MinMaxStringValue,duckdb::GreaterThan>>
        ;
        pcVar9 = MinMaxNOperation::
                 Finalize<duckdb::ArgMinMaxNState<duckdb::MinMaxStringValue,duckdb::MinMaxStringValue,duckdb::GreaterThan>>
        ;
        pcVar10 = AggregateFunction::
                  StateDestroy<duckdb::ArgMinMaxNState<duckdb::MinMaxStringValue,duckdb::MinMaxStringValue,duckdb::GreaterThan>,duckdb::MinMaxNOperation>
        ;
        pcVar11 = AggregateFunction::
                  StateCombine<duckdb::ArgMinMaxNState<duckdb::MinMaxStringValue,duckdb::MinMaxStringValue,duckdb::GreaterThan>,duckdb::MinMaxNOperation>
        ;
        pcVar12 = AggregateFunction::
                  StateInitialize<duckdb::ArgMinMaxNState<duckdb::MinMaxStringValue,duckdb::MinMaxStringValue,duckdb::GreaterThan>,duckdb::MinMaxNOperation,(duckdb::AggregateDestructorType)1>
        ;
        pcVar13 = AggregateFunction::
                  StateSize<duckdb::ArgMinMaxNState<duckdb::MinMaxStringValue,duckdb::MinMaxStringValue,duckdb::GreaterThan>>
        ;
        break;
      }
    case (Expression)0x8:
    case (Expression)0xa:
      pcVar8 = 
      ArgMinMaxNUpdate<duckdb::ArgMinMaxNState<duckdb::MinMaxStringValue,duckdb::MinMaxFallbackValue,duckdb::GreaterThan>>
      ;
      pcVar9 = MinMaxNOperation::
               Finalize<duckdb::ArgMinMaxNState<duckdb::MinMaxStringValue,duckdb::MinMaxFallbackValue,duckdb::GreaterThan>>
      ;
      pcVar10 = AggregateFunction::
                StateDestroy<duckdb::ArgMinMaxNState<duckdb::MinMaxStringValue,duckdb::MinMaxFallbackValue,duckdb::GreaterThan>,duckdb::MinMaxNOperation>
      ;
      pcVar11 = AggregateFunction::
                StateCombine<duckdb::ArgMinMaxNState<duckdb::MinMaxStringValue,duckdb::MinMaxFallbackValue,duckdb::GreaterThan>,duckdb::MinMaxNOperation>
      ;
      pcVar12 = AggregateFunction::
                StateInitialize<duckdb::ArgMinMaxNState<duckdb::MinMaxStringValue,duckdb::MinMaxFallbackValue,duckdb::GreaterThan>,duckdb::MinMaxNOperation,(duckdb::AggregateDestructorType)1>
      ;
      pcVar13 = AggregateFunction::
                StateSize<duckdb::ArgMinMaxNState<duckdb::MinMaxStringValue,duckdb::MinMaxFallbackValue,duckdb::GreaterThan>>
      ;
    }
  }
  function->state_size = pcVar13;
  function->initialize = pcVar12;
  function->combine = pcVar11;
  function->destructor = pcVar10;
  function->finalize = pcVar9;
  function->update = pcVar8;
  pvVar7 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
           ::operator[](arguments,0);
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->(pvVar7);
  duckdb::LogicalType::LIST(&local_40);
  function->field_0x90 = local_40;
  function->field_0x91 = local_3f;
  uVar4 = *(undefined8 *)&function->field_0x98;
  uVar5 = *(undefined8 *)&function->field_0xa0;
  *(undefined8 *)&function->field_0x98 = local_38;
  *(undefined8 *)&function->field_0xa0 = uStack_30;
  local_38 = uVar4;
  uStack_30 = uVar5;
  duckdb::LogicalType::~LogicalType(&local_40);
  *(undefined8 *)this = 0;
  return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
         (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)this;
}

Assistant:

unique_ptr<FunctionData> ArgMinMaxNBind(ClientContext &context, AggregateFunction &function,
                                        vector<unique_ptr<Expression>> &arguments) {
	for (auto &arg : arguments) {
		if (arg->return_type.id() == LogicalTypeId::UNKNOWN) {
			throw ParameterNotResolvedException();
		}
	}

	const auto val_type = arguments[0]->return_type.InternalType();
	const auto arg_type = arguments[1]->return_type.InternalType();

	// Specialize the function based on the input types
	SpecializeArgMinMaxNFunction<COMPARATOR>(val_type, arg_type, function);

	function.return_type = LogicalType::LIST(arguments[0]->return_type);
	return nullptr;
}